

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

EntryType * __thiscall
JsUtil::
BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::
IteratorBase<JsUtil::BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
::Current(IteratorBase<JsUtil::BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
          *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  long lVar4;
  EntryType *pEVar5;
  
  bVar2 = EntryIterator<JsUtil::BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
          ::IsValid((EntryIterator<JsUtil::BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                     *)this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x4d9,"(IsValid_Virtual())","IsValid_Virtual()");
    if (!bVar2) goto LAB_004afbff;
    *puVar3 = 0;
  }
  pEVar5 = this->entries;
  lVar4 = (long)this->entryIndex;
  if (pEVar5[lVar4].
      super_DefaultHashedEntry<IntBoundCheckCompatibilityId,_IntBoundCheck,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
      .super_ImplicitKeyValueEntry<IntBoundCheckCompatibilityId,_IntBoundCheck>.
      super_ValueEntry<IntBoundCheck,_JsUtil::(anonymous_namespace)::ValueEntryData<IntBoundCheck>_>
      .super_ValueEntryData<IntBoundCheck>.next < -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x4da,"(!IsFreeEntry(entries[entryIndex]))",
                       "!IsFreeEntry(entries[entryIndex])");
    if (!bVar2) {
LAB_004afbff:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pEVar5 = this->entries;
    lVar4 = (long)this->entryIndex;
  }
  return pEVar5 + lVar4;
}

Assistant:

EntryType &Current() const
            {
                Assert(IsValid_Virtual());
                Assert(!IsFreeEntry(entries[entryIndex]));

                return entries[entryIndex];
            }